

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O3

void __thiscall Logger::printError(Logger *this,ErrorType type,string_view text)

{
  bool *pbVar1;
  char *extraout_RDX;
  int iVar2;
  string_view text_00;
  string errorText;
  string local_30;
  
  if (suppressLevel != 0) {
    return;
  }
  iVar2 = (int)this;
  formatError_abi_cxx11_
            (&local_30,(Logger *)((ulong)this & 0xffffffff),(ErrorType)text._M_len,text._M_str);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&errors_abi_cxx11_,&local_30);
  if (silent == false) {
    text_00._M_str = extraout_RDX;
    text_00._M_len = (size_t)local_30._M_dataplus._M_p;
    printLine((Logger *)local_30._M_string_length,text_00);
  }
  if (iVar2 == 2) {
    error = true;
    pbVar1 = &fatalError;
  }
  else {
    pbVar1 = &error;
    if ((iVar2 != 1) && ((iVar2 != 0 || (errorOnWarning == false)))) goto LAB_0013f1ab;
  }
  *pbVar1 = true;
LAB_0013f1ab:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Logger::printError(ErrorType type, const std::string_view text)
{
	if (suppressLevel)
		return;

	std::string errorText = formatError(type,text.data());
	errors.push_back(errorText);

	if (!silent)
		printLine(errorText);

	setFlags(type);
}